

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

void __thiscall Zippy::ZipArchive::DeleteEntry(ZipArchive *this,string *name)

{
  bool bVar1;
  ZipLogicError *this_00;
  iterator __last;
  ZipArchive *in_RDI;
  string *in_stack_ffffffffffffff58;
  vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *this_01;
  __normal_iterator<const_Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  *in_stack_ffffffffffffff60;
  anon_class_8_1_898f2789_for__M_pred in_stack_ffffffffffffff78;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  bVar1 = IsOpen(in_RDI);
  if (!bVar1) {
    this_00 = (ZipLogicError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ZipLogicError::ZipLogicError(this_00,in_stack_ffffffffffffff58);
    __cxa_throw(this_00,&ZipLogicError::typeinfo,ZipLogicError::~ZipLogicError);
  }
  this_01 = &in_RDI->m_ZipEntries;
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::begin(this_01);
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end(this_01);
  std::
  remove_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,Zippy::ZipArchive::DeleteEntry(std::__cxx11::string_const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>
            ((__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
              )in_stack_ffffffffffffff88._M_current,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<Zippy::Impl::ZipEntry_const*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>
  ::__normal_iterator<Zippy::Impl::ZipEntry*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
              *)this_01);
  __last = std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end(this_01);
  __gnu_cxx::
  __normal_iterator<Zippy::Impl::ZipEntry_const*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>
  ::__normal_iterator<Zippy::Impl::ZipEntry*>
            (in_stack_ffffffffffffff60,
             (__normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
              *)this_01);
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::erase
            ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
             in_stack_ffffffffffffff78.name,in_stack_ffffffffffffff88,
             (const_iterator)__last._M_current);
  return;
}

Assistant:

void DeleteEntry(const std::string& name) {

            if (!IsOpen()) throw ZipLogicError("Cannot call DeleteEntry on empty ZipArchive object!");

            m_ZipEntries
                    .erase(std::remove_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                        return name == entry.GetName();
                    }), m_ZipEntries.end());
        }